

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int convert_fast_array_to_array(JSContext *ctx,JSObject *p)

{
  uint8_t *puVar1;
  uint uVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  int iVar5;
  JSProperty *pJVar6;
  uint uVar7;
  int iVar8;
  JSValueUnion *pJVar9;
  
  iVar5 = js_shape_prepare_update(ctx,p,(JSShapeProperty **)0x0);
  iVar8 = -1;
  if (iVar5 == 0) {
    uVar2 = (p->u).array.count;
    uVar7 = p->shape->prop_count + uVar2;
    if (((uint)p->shape->prop_size < uVar7) &&
       (iVar5 = resize_properties(ctx,&p->shape,p,uVar7), iVar5 != 0)) {
      return -1;
    }
    if (uVar2 != 0) {
      pJVar9 = (JSValueUnion *)(p->u).func.var_refs;
      uVar7 = 0;
      do {
        pJVar6 = add_property(ctx,p,uVar7 | 0x80000000,7);
        JVar3 = *pJVar9;
        JVar4 = pJVar9[1];
        pJVar9 = pJVar9 + 2;
        (pJVar6->u).value.u = JVar3;
        (pJVar6->u).value.tag = (int64_t)JVar4;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,(p->u).func.var_refs);
    iVar8 = 0;
    (p->u).array.count = 0;
    (p->u).func.var_refs = (JSVarRef **)0x0;
    *(undefined4 *)&p->u = 0;
    puVar1 = &(p->field_0).header.dummy1;
    *puVar1 = *puVar1 & 0xf7;
  }
  return iVar8;
}

Assistant:

int convert_fast_array_to_array(JSContext *ctx,
                                                             JSObject *p)
{
    JSProperty *pr;
    JSShape *sh;
    JSValue *tab;
    uint32_t i, len, new_count;

    if (js_shape_prepare_update(ctx, p, NULL))
        return -1;
    len = p->u.array.count;
    /* resize the properties once to simplify the error handling */
    sh = p->shape;
    new_count = sh->prop_count + len;
    if (new_count > sh->prop_size) {
        if (resize_properties(ctx, &p->shape, p, new_count))
            return -1;
    }

    tab = p->u.array.u.values;
    for(i = 0; i < len; i++) {
        /* add_property cannot fail here but
           __JS_AtomFromUInt32(i) fails for i > INT32_MAX */
        pr = add_property(ctx, p, __JS_AtomFromUInt32(i), JS_PROP_C_W_E);
        pr->u.value = *tab++;
    }
    js_free(ctx, p->u.array.u.values);
    p->u.array.count = 0;
    p->u.array.u.values = NULL; /* fail safe */
    p->u.array.u1.size = 0;
    p->fast_array = 0;
    return 0;
}